

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O0

Solution * Genetic::run(int max_iter)

{
  Solution *pSVar1;
  bool bVar2;
  reference ppVar3;
  reference ppVar4;
  ostream *poVar5;
  _List_iterator<std::pair<Solution_*,_double>_> local_f0;
  _List_node_base *local_e8;
  iterator local_e0;
  const_iterator local_d8;
  const_iterator local_d0;
  _Self local_c8;
  _Self local_c0;
  iterator it2;
  iterator it;
  pair<Solution_*,_double> solution;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_> *__range2_1;
  Solution *local_70;
  pair<Solution_*,_double> local_68;
  Solution *pSStack_58;
  pair<Solution_*,_Solution_*> parent;
  iterator __end2;
  iterator __begin2;
  list<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
  *__range2;
  list<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
  parents;
  int max_iter_local;
  
  generate_population();
  std::__cxx11::list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
  ::sort<solutions_comparator>(&solutions_abi_cxx11_);
  while( true ) {
    bVar2 = avaliate_population();
    if (!bVar2) break;
    select_parents_abi_cxx11_();
    __end2 = std::__cxx11::
             list<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
             ::begin((list<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
                      *)&__range2);
    parent.second =
         (Solution *)
         std::__cxx11::
         list<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
         ::end((list<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
                *)&__range2);
    while( true ) {
      bVar2 = std::operator!=(&__end2,(_Self *)&parent.second);
      if (!bVar2) break;
      ppVar4 = std::_List_iterator<std::pair<Solution_*,_Solution_*>_>::operator*(&__end2);
      pSStack_58 = ppVar4->first;
      parent.first = ppVar4->second;
      local_70 = generate_child(pSStack_58,parent.first);
      __range2_1._0_4_ = 0;
      std::pair<Solution_*,_double>::pair<Solution_*,_int,_true>
                (&local_68,&local_70,(int *)&__range2_1);
      std::__cxx11::
      list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::
      push_back(&solutions_abi_cxx11_,&local_68);
      std::_List_iterator<std::pair<Solution_*,_Solution_*>_>::operator++(&__end2);
    }
    max_weight = 0.0;
    __end2_1 = std::__cxx11::
               list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
               ::begin(&solutions_abi_cxx11_);
    solution.second =
         (double)std::__cxx11::
                 list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                 ::end(&solutions_abi_cxx11_);
    while( true ) {
      bVar2 = std::operator!=(&__end2_1,(_Self *)&solution.second);
      if (!bVar2) break;
      ppVar3 = std::_List_iterator<std::pair<Solution_*,_double>_>::operator*(&__end2_1);
      pSVar1 = ppVar3->first;
      solution.first = (Solution *)ppVar3->second;
      Solution::mutate(pSVar1);
      if (max_weight < pSVar1->weight) {
        max_weight = pSVar1->weight;
      }
      std::_List_iterator<std::pair<Solution_*,_double>_>::operator++(&__end2_1);
    }
    std::__cxx11::
    list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::
    sort<solutions_comparator>(&solutions_abi_cxx11_);
    it2 = std::__cxx11::
          list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::
          begin(&solutions_abi_cxx11_);
    std::advance<std::_List_iterator<std::pair<Solution*,double>>,int>(&it2,population_limit);
    local_c0._M_node = it2._M_node;
    while( true ) {
      local_c8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::end
                     (&solutions_abi_cxx11_);
      bVar2 = std::operator!=(&local_c0,&local_c8);
      if (!bVar2) break;
      ppVar3 = std::_List_iterator<std::pair<Solution_*,_double>_>::operator*(&local_c0);
      pSVar1 = ppVar3->first;
      if (pSVar1 != (Solution *)0x0) {
        Solution::~Solution(pSVar1);
        operator_delete(pSVar1);
      }
      std::_List_iterator<std::pair<Solution_*,_double>_>::operator++(&local_c0);
    }
    std::_List_const_iterator<std::pair<Solution_*,_double>_>::_List_const_iterator(&local_d0,&it2);
    local_e0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::end
                   (&solutions_abi_cxx11_);
    std::_List_const_iterator<std::pair<Solution_*,_double>_>::_List_const_iterator
              (&local_d8,&local_e0);
    local_e8 = (_List_node_base *)
               std::__cxx11::
               list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
               ::erase(&solutions_abi_cxx11_,local_d0,local_d8);
    poVar5 = std::operator<<((ostream *)&std::cout,"Genetic iteration, best solution: ");
    local_f0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::begin
                   (&solutions_abi_cxx11_);
    ppVar3 = std::_List_iterator<std::pair<Solution_*,_double>_>::operator*(&local_f0);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,ppVar3->first->weight);
    std::operator<<(poVar5,"\n");
    std::__cxx11::
    list<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>::
    ~list((list<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
           *)&__range2);
  }
  parents.
  super__List_base<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
  ._M_impl._M_node._M_size =
       (size_t)std::__cxx11::
               list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
               ::begin(&solutions_abi_cxx11_);
  ppVar3 = std::_List_iterator<std::pair<Solution_*,_double>_>::operator*
                     ((_List_iterator<std::pair<Solution_*,_double>_> *)
                      &parents.
                       super__List_base<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
                       ._M_impl._M_node._M_size);
  return ppVar3->first;
}

Assistant:

Solution* Genetic::run(int max_iter)
{
	generate_population();
	solutions.sort(solutions_comparator());
	while (true || max_iter-- > 0)
	{
		if (!avaliate_population())
		{
			return (*solutions.begin()).first;
		}
		std::list<std::pair<Solution*, Solution*>> parents = select_parents();

		//Generate childs and add to solutions pool
		for (auto parent : parents)
		{
			solutions.push_back(std::pair<Solution*, double>(generate_child(parent.first, parent.second), 0));
		}

		//Mutate solutions
		max_weight = 0;
		for (auto solution : solutions)
		{
			solution.first->mutate();

			if (solution.first->weight > max_weight)
				max_weight = solution.first->weight;
		}


		//Kill the worst		
		solutions.sort(solutions_comparator());
		auto it = solutions.begin();
		std::advance(it, population_limit);

		auto it2 = it;
		for (; it2 != solutions.end(); ++it2)
			delete (*it2).first;

		solutions.erase(it, solutions.end());

		std::cout << "Genetic iteration, best solution: " << (*solutions.begin()).first->weight << "\n";
	}
	return solutions.begin()->first;
}